

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cpp
# Opt level: O2

void __thiscall Symbol_Table::free_subroutine(Symbol_Table *this)

{
  IdentifierData *this_00;
  _Base_ptr p_Var1;
  
  for (p_Var1 = (this->subroutine_scope)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->subroutine_scope)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    this_00 = *(IdentifierData **)(p_Var1 + 2);
    if (this_00 != (IdentifierData *)0x0) {
      IdentifierData::~IdentifierData(this_00);
    }
    operator_delete(this_00,0x48);
  }
  return;
}

Assistant:

void Symbol_Table::free_subroutine() {
    for (auto& it : subroutine_scope) {
        delete it.second;
    }
}